

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O0

void __thiscall QCborStreamWriter::QCborStreamWriter(QCborStreamWriter *this,QByteArray *data)

{
  QFlags<QIODeviceBase::OpenModeFlag> QVar1;
  QIODevice *pQVar2;
  pointer pQVar3;
  QBuffer *in_RSI;
  unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_> *in_RDI;
  pointer in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  QByteArray *in_stack_ffffffffffffffe8;
  
  operator_new(0x48);
  pQVar2 = (QIODevice *)operator_new(0x10);
  QBuffer::QBuffer(in_RSI,in_stack_ffffffffffffffe8,
                   (QObject *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  QCborStreamWriterPrivate::QCborStreamWriterPrivate
            ((QCborStreamWriterPrivate *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),pQVar2);
  std::unique_ptr<QCborStreamWriterPrivate,std::default_delete<QCborStreamWriterPrivate>>::
  unique_ptr<std::default_delete<QCborStreamWriterPrivate>,void>(in_RDI,in_stack_ffffffffffffffb8);
  pQVar3 = std::unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
           ::operator->((unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
                         *)0x8ddf30);
  pQVar3->deleteDevice = true;
  pQVar3 = std::unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
           ::operator->((unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
                         *)0x8ddf3e);
  pQVar2 = pQVar3->device;
  QVar1 = ::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  (*(pQVar2->super_QObject)._vptr_QObject[0xd])
            (pQVar2,(ulong)(uint)QVar1.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                                 super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  return;
}

Assistant:

QCborStreamWriter::QCborStreamWriter(QByteArray *data)
    : d(new QCborStreamWriterPrivate(new QBuffer(data)))
{
    d->deleteDevice = true;
    d->device->open(QIODevice::WriteOnly | QIODevice::Unbuffered);
}